

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split_inl.hpp
# Opt level: O2

tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::get_names
            (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *input,bool allow_non_standard)

{
  pointer pbVar1;
  bool bVar2;
  BadNameString *pBVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer pbVar4;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  short_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_names;
  string pos_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  short_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  short_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  short_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pos_name._M_dataplus._M_p = (pointer)&pos_name.field_2;
  pos_name._M_string_length = 0;
  pos_name.field_2._M_local_buf[0] = '\0';
  pbVar4 = (input->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (input->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar4 == pbVar1) {
      ::std::
      _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
      ::
      _Tuple_impl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&,void>
                ((_Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                  *)__return_storage_ptr__,&short_names,&long_names,&pos_name);
      ::std::__cxx11::string::~string((string *)&pos_name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&long_names);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&short_names);
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::string((string *)&name,(string *)pbVar4);
    if (name._M_string_length != 0) {
      if (name._M_string_length != 1) {
        if (*name._M_dataplus._M_p == '-') {
          if (name._M_dataplus._M_p[1] == 0x2d) goto LAB_0015cbb7;
          if (name._M_string_length == 2) {
            if ((byte)name._M_dataplus._M_p[1] < 0x22) {
              pBVar3 = (BadNameString *)__cxa_allocate_exception(0x38);
              ::std::__cxx11::string::string((string *)&local_90,(string *)&name);
              BadNameString::OneCharName(pBVar3,&local_90);
              __cxa_throw(pBVar3,&BadNameString::typeinfo,Error::~Error);
            }
            local_130._M_dataplus._M_p._0_4_ = 1;
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<int,char&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &short_names,(int *)&local_130,name._M_dataplus._M_p + 1);
            goto LAB_0015ccab;
          }
          if (!allow_non_standard) {
            pBVar3 = (BadNameString *)__cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string((string *)&local_70,(string *)&name);
            BadNameString::MissingDash(pBVar3,&local_70);
            __cxa_throw(pBVar3,&BadNameString::typeinfo,Error::~Error);
          }
          ::std::__cxx11::string::substr((ulong)&local_130,(ulong)&name);
          ::std::__cxx11::string::operator=((string *)&name,(string *)&local_130);
          ::std::__cxx11::string::~string((string *)&local_130);
          bVar2 = valid_name_string(&name);
          this = &short_names;
          if (!bVar2) {
            pBVar3 = (BadNameString *)__cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string((string *)&local_50,(string *)&name);
            BadNameString::BadLongName(pBVar3,&local_50);
            __cxa_throw(pBVar3,&BadNameString::typeinfo,Error::~Error);
          }
LAB_0015cd39:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this,&name);
          goto LAB_0015ccab;
        }
LAB_0015cbb7:
        if (2 < name._M_string_length) {
          ::std::__cxx11::string::substr((ulong)&local_130,(ulong)&name);
          bVar2 = ::std::operator==(&local_130,"--");
          ::std::__cxx11::string::~string((string *)&local_130);
          if (bVar2) {
            ::std::__cxx11::string::substr((ulong)&local_130,(ulong)&name);
            ::std::__cxx11::string::operator=((string *)&name,(string *)&local_130);
            ::std::__cxx11::string::~string((string *)&local_130);
            bVar2 = valid_name_string(&name);
            this = &long_names;
            if (!bVar2) {
              pBVar3 = (BadNameString *)__cxa_allocate_exception(0x38);
              ::std::__cxx11::string::string((string *)&local_b0,(string *)&name);
              BadNameString::BadLongName(pBVar3,&local_b0);
              __cxa_throw(pBVar3,&BadNameString::typeinfo,Error::~Error);
            }
            goto LAB_0015cd39;
          }
        }
      }
      bVar2 = ::std::operator==(&name,"-");
      if (bVar2) {
LAB_0015cd90:
        pBVar3 = (BadNameString *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string((string *)&local_d0,(string *)&name);
        BadNameString::ReservedName(pBVar3,&local_d0);
        __cxa_throw(pBVar3,&BadNameString::typeinfo,Error::~Error);
      }
      bVar2 = ::std::operator==(&name,"--");
      if (bVar2) goto LAB_0015cd90;
      bVar2 = ::std::operator==(&name,"++");
      if (bVar2) goto LAB_0015cd90;
      if (pos_name._M_string_length != 0) {
        pBVar3 = (BadNameString *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string((string *)&local_f0,(string *)&name);
        BadNameString::MultiPositionalNames(pBVar3,&local_f0);
        __cxa_throw(pBVar3,&BadNameString::typeinfo,Error::~Error);
      }
      bVar2 = valid_name_string(&name);
      if (!bVar2) {
        pBVar3 = (BadNameString *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string((string *)&local_110,(string *)&name);
        BadNameString::BadPositionalName(pBVar3,&local_110);
        __cxa_throw(pBVar3,&BadNameString::typeinfo,Error::~Error);
      }
      ::std::__cxx11::string::_M_assign((string *)&pos_name);
    }
LAB_0015ccab:
    ::std::__cxx11::string::~string((string *)&name);
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

CLI11_INLINE std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>
get_names(const std::vector<std::string> &input, bool allow_non_standard) {

    std::vector<std::string> short_names;
    std::vector<std::string> long_names;
    std::string pos_name;
    for(std::string name : input) {
        if(name.empty()) {
            continue;
        }
        if(name.length() > 1 && name[0] == '-' && name[1] != '-') {
            if(name.length() == 2 && valid_first_char(name[1])) {
                short_names.emplace_back(1, name[1]);
            } else if(name.length() > 2) {
                if(allow_non_standard) {
                    name = name.substr(1);
                    if(valid_name_string(name)) {
                        short_names.push_back(name);
                    } else {
                        throw BadNameString::BadLongName(name);
                    }
                } else {
                    throw BadNameString::MissingDash(name);
                }
            } else {
                throw BadNameString::OneCharName(name);
            }
        } else if(name.length() > 2 && name.substr(0, 2) == "--") {
            name = name.substr(2);
            if(valid_name_string(name)) {
                long_names.push_back(name);
            } else {
                throw BadNameString::BadLongName(name);
            }
        } else if(name == "-" || name == "--" || name == "++") {
            throw BadNameString::ReservedName(name);
        } else {
            if(!pos_name.empty()) {
                throw BadNameString::MultiPositionalNames(name);
            }
            if(valid_name_string(name)) {
                pos_name = name;
            } else {
                throw BadNameString::BadPositionalName(name);
            }
        }
    }
    return std::make_tuple(short_names, long_names, pos_name);
}